

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O1

VariablesWithType * __thiscall
soul::heart::Utilities::VariableListByType::getType(VariableListByType *this,Type *typeNeeded)

{
  VariablesWithType *this_00;
  VariablesWithType *pVVar1;
  bool bVar2;
  vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
  *__range2;
  VariablesWithType *this_01;
  VariablesWithType *pVVar3;
  bool bVar4;
  VariablesWithType local_60;
  
  this_00 = (this->types).
            super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (this->types).
           super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = this_00 == pVVar1;
  pVVar3 = this_00;
  if (!bVar4) {
    bVar2 = Type::isEqual(&this_00->type,typeNeeded,0);
    this_01 = this_00;
    while (pVVar3 = this_01, !bVar2) {
      this_01 = this_01 + 1;
      bVar4 = this_01 == pVVar1;
      pVVar3 = this_00;
      if (bVar4) break;
      bVar2 = Type::isEqual(&this_01->type,typeNeeded,0);
    }
  }
  if (bVar4) {
    local_60.type.category = typeNeeded->category;
    local_60.type.arrayElementCategory = typeNeeded->arrayElementCategory;
    local_60.type.isRef = typeNeeded->isRef;
    local_60.type.isConstant = typeNeeded->isConstant;
    local_60.type.primitiveType.type = (typeNeeded->primitiveType).type;
    local_60.type.boundingSize = typeNeeded->boundingSize;
    local_60.type.arrayElementBoundingSize = typeNeeded->arrayElementBoundingSize;
    local_60.type.structure.object = (typeNeeded->structure).object;
    (typeNeeded->structure).object = (Structure *)0x0;
    local_60.variables.
    super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60.variables.
    super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_60.variables.
    super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
    ::emplace_back<soul::heart::Utilities::VariableListByType::VariablesWithType>
              (&this->types,&local_60);
    if (local_60.variables.
        super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.variables.
                      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.variables.
                            super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.variables.
                            super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(local_60.type.structure.object);
    pVVar3 = (this->types).
             super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  return pVVar3;
}

Assistant:

VariablesWithType& getType (Type typeNeeded)
        {
            for (auto& type : types)
                if (type.type.isIdentical (typeNeeded))
                    return type;

            types.push_back ({ std::move (typeNeeded), {} });
            return types.back();
        }